

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::SerializeWithCachedSizes
          (DictionaryValue_KeyValuePair *this,CodedOutputStream *output)

{
  if (this->key_ != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->key_->super_MessageLite,output);
  }
  if (this->value_ != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->value_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void DictionaryValue_KeyValuePair::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.Value key = 1;
  if (this->has_key()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->key_, output);
  }

  // .CoreML.Specification.MILSpec.Value value = 2;
  if (this->has_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->value_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
}